

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UBool __thiscall icu_63::UnicodeSet::contains(UnicodeSet *this,UnicodeString *s)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  bool bVar5;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 == 0) {
    bVar5 = false;
  }
  else {
    iVar4 = getSingleCP(s);
    if (-1 < iVar4) {
      UVar2 = contains(this,iVar4);
      return UVar2;
    }
    iVar4 = UVector::indexOf(this->strings,s,0);
    bVar5 = -1 < iVar4;
  }
  return bVar5;
}

Assistant:

UBool UnicodeSet::contains(const UnicodeString& s) const {
    if (s.length() == 0) return FALSE;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        return strings->contains((void*) &s);
    } else {
        return contains((UChar32) cp);
    }
}